

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotated_binary_text_gen.cpp
# Opt level: O0

string * __thiscall
flatbuffers::(anonymous_namespace)::GenerateTypeString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,BinaryRegion *region)

{
  long lVar1;
  allocator<char> local_a7;
  byte local_a6;
  byte local_a5;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  _anonymous_namespace_ *local_18;
  BinaryRegion *region_local;
  
  local_18 = this;
  region_local = (BinaryRegion *)__return_storage_ptr__;
  flatbuffers::ToString_abi_cxx11_
            (&local_38,(flatbuffers *)(ulong)*(uint *)(this + 0x10),(BinaryRegionType)region);
  lVar1 = *(long *)(local_18 + 0x18);
  local_a5 = 0;
  local_a6 = 0;
  if (lVar1 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_a7);
  }
  else {
    std::__cxx11::to_string(&local_98,*(unsigned_long *)(local_18 + 0x18));
    local_a5 = 1;
    std::operator+(&local_78,"[",&local_98);
    local_a6 = 1;
    std::operator+(&local_58,&local_78,"]");
  }
  std::operator+(__return_storage_ptr__,&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (lVar1 == 0) {
    std::allocator<char>::~allocator(&local_a7);
  }
  if ((local_a6 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_78);
  }
  if ((local_a5 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_98);
  }
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

static std::string GenerateTypeString(const BinaryRegion &region) {
  return ToString(region.type) +
         ((region.array_length)
              ? "[" + std::to_string(region.array_length) + "]"
              : "");
}